

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflatePending(z_streamp strm,uint *pending,int *bits)

{
  int iVar1;
  int *bits_local;
  uint *pending_local;
  z_streamp strm_local;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    if (pending != (uint *)0x0) {
      *pending = (uint)strm->state->pending;
    }
    if (bits != (int *)0x0) {
      *bits = strm->state->bi_valid;
    }
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflatePending(z_streamp strm, unsigned *pending, int *bits) {
    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    if (pending != Z_NULL)
        *pending = strm->state->pending;
    if (bits != Z_NULL)
        *bits = strm->state->bi_valid;
    return Z_OK;
}